

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::
       fill<kj::ArrayPtr<char_const>,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&>
                 (char *target,ArrayPtr<const_char> *first,StringPtr *rest,
                 ArrayPtr<const_char> *rest_1,StringPtr *rest_2,ArrayPtr<const_char> *rest_3,
                 StringPtr *rest_4)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    pcVar2 = first->ptr;
    sVar3 = 0;
    do {
      target[sVar3] = pcVar2[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
    target = target + sVar3;
  }
  pcVar2 = (rest->content).ptr;
  sVar1 = (rest->content).size_;
  if (pcVar2 != pcVar2 + (sVar1 - 1)) {
    lVar4 = 0;
    do {
      target[lVar4] = pcVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (sVar1 - 1 != lVar4);
    target = target + lVar4;
  }
  pcVar2 = fill<kj::ArrayPtr<char_const>,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&>
                     (target,rest_1,rest_2,rest_3,rest_4);
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}